

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *this_00;
  undefined8 uVar1;
  bool bVar2;
  mapped_type *pmVar3;
  runtime_error *this_01;
  long *in_RDX;
  char *pcVar4;
  undefined1 local_a8 [32];
  string id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  this_00 = (XML *)*in_RDX;
  std::__cxx11::string::string((string *)local_a8,"id",(allocator *)&local_68);
  XML::parm(&id,this_00,(string *)local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  pcVar4 = "PointLight";
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (*in_RDX + 0x30),"PointLight");
  if (bVar2) {
    loadPointLight((XMLLoader *)local_a8,(Ref<embree::XML> *)pcVar4);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                           *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_parent,&id);
    if (pmVar3->ptr != (Node *)0x0) {
      (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    uVar1 = local_a8._0_8_;
    pmVar3->ptr = (Node *)local_a8._0_8_;
    local_a8._0_8_ = (pointer)0x0;
    (this->path).filename._M_dataplus._M_p = (pointer)uVar1;
    if ((Node *)uVar1 != (Node *)0x0) {
      (**(code **)(*(long *)uVar1 + 0x10))();
    }
  }
  else {
    pcVar4 = "SpotLight";
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*in_RDX + 0x30),"SpotLight");
    if (bVar2) {
      loadSpotLight((XMLLoader *)local_a8,(Ref<embree::XML> *)pcVar4);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                             *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_parent,&id);
      if (pmVar3->ptr != (Node *)0x0) {
        (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      uVar1 = local_a8._0_8_;
      pmVar3->ptr = (Node *)local_a8._0_8_;
      local_a8._0_8_ = (pointer)0x0;
      (this->path).filename._M_dataplus._M_p = (pointer)uVar1;
      if ((Node *)uVar1 != (Node *)0x0) {
        (**(code **)(*(long *)uVar1 + 0x10))();
      }
    }
    else {
      pcVar4 = "DirectionalLight";
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"DirectionalLight");
      if (bVar2) {
        loadDirectionalLight((XMLLoader *)local_a8,(Ref<embree::XML> *)pcVar4);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&id);
        if (pmVar3->ptr != (Node *)0x0) {
          (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        uVar1 = local_a8._0_8_;
        pmVar3->ptr = (Node *)local_a8._0_8_;
        local_a8._0_8_ = (pointer)0x0;
        (this->path).filename._M_dataplus._M_p = (pointer)uVar1;
        if ((Node *)uVar1 != (Node *)0x0) {
          (**(code **)(*(long *)uVar1 + 0x10))();
        }
      }
      else {
        pcVar4 = "DistantLight";
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(*in_RDX + 0x30),"DistantLight");
        if (bVar2) {
          loadDistantLight((XMLLoader *)local_a8,(Ref<embree::XML> *)pcVar4);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                 *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                    _M_header._M_parent,&id);
          if (pmVar3->ptr != (Node *)0x0) {
            (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
          }
          uVar1 = local_a8._0_8_;
          pmVar3->ptr = (Node *)local_a8._0_8_;
          local_a8._0_8_ = (pointer)0x0;
          (this->path).filename._M_dataplus._M_p = (pointer)uVar1;
          if ((Node *)uVar1 != (Node *)0x0) {
            (**(code **)(*(long *)uVar1 + 0x10))();
          }
        }
        else {
          pcVar4 = "AmbientLight";
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(*in_RDX + 0x30),"AmbientLight");
          if (bVar2) {
            loadAmbientLight((XMLLoader *)local_a8,(Ref<embree::XML> *)pcVar4);
            pmVar3 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                   *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                      _M_header._M_parent,&id);
            if (pmVar3->ptr != (Node *)0x0) {
              (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
            }
            uVar1 = local_a8._0_8_;
            pmVar3->ptr = (Node *)local_a8._0_8_;
            local_a8._0_8_ = (pointer)0x0;
            (this->path).filename._M_dataplus._M_p = (pointer)uVar1;
            if ((Node *)uVar1 != (Node *)0x0) {
              (**(code **)(*(long *)uVar1 + 0x10))();
            }
          }
          else {
            pcVar4 = "TriangleLight";
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(*in_RDX + 0x30),"TriangleLight");
            if (bVar2) {
              loadTriangleLight((XMLLoader *)local_a8,(Ref<embree::XML> *)pcVar4);
              pmVar3 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                     *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                        _M_header._M_parent,&id);
              if (pmVar3->ptr != (Node *)0x0) {
                (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
              }
              uVar1 = local_a8._0_8_;
              pmVar3->ptr = (Node *)local_a8._0_8_;
              local_a8._0_8_ = (pointer)0x0;
              (this->path).filename._M_dataplus._M_p = (pointer)uVar1;
              if ((Node *)uVar1 != (Node *)0x0) {
                (**(code **)(*(long *)uVar1 + 0x10))();
              }
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(*in_RDX + 0x30),"AnimatedLight");
              if (bVar2) {
                loadAnimatedLight((XMLLoader *)local_a8,xml);
                pmVar3 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                       *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                          _M_header._M_parent,&id);
                if (pmVar3->ptr != (Node *)0x0) {
                  (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
                }
                uVar1 = local_a8._0_8_;
                pmVar3->ptr = (Node *)local_a8._0_8_;
                local_a8._0_8_ = (pointer)0x0;
                (this->path).filename._M_dataplus._M_p = (pointer)uVar1;
                if ((Node *)uVar1 != (Node *)0x0) {
                  (**(code **)(*(long *)uVar1 + 0x10))();
                }
              }
              else {
                pcVar4 = "QuadLight";
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(*in_RDX + 0x30),"QuadLight");
                if (!bVar2) {
                  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                  ParseLocation::str_abi_cxx11_(&local_48,(ParseLocation *)(*in_RDX + 0x10));
                  std::operator+(&local_68,&local_48,": invalid light node: ");
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_a8,&local_68,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(*in_RDX + 0x30));
                  std::runtime_error::runtime_error(this_01,(string *)local_a8);
                  __cxa_throw(this_01,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                loadQuadLight((XMLLoader *)local_a8,(Ref<embree::XML> *)pcVar4);
                pmVar3 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                       *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                          _M_header._M_parent,&id);
                if (pmVar3->ptr != (Node *)0x0) {
                  (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
                }
                uVar1 = local_a8._0_8_;
                pmVar3->ptr = (Node *)local_a8._0_8_;
                local_a8._0_8_ = (pointer)0x0;
                (this->path).filename._M_dataplus._M_p = (pointer)uVar1;
                if ((Node *)uVar1 != (Node *)0x0) {
                  (**(code **)(*(long *)uVar1 + 0x10))();
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&id);
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadLight(const Ref<XML>& xml) 
   {
     const std::string id = xml->parm("id");
     if      (xml->name == "PointLight"      ) return state.sceneMap[id] = loadPointLight      (xml);
     else if (xml->name == "SpotLight"       ) return state.sceneMap[id] = loadSpotLight       (xml);
     else if (xml->name == "DirectionalLight") return state.sceneMap[id] = loadDirectionalLight(xml);
     else if (xml->name == "DistantLight"    ) return state.sceneMap[id] = loadDistantLight    (xml);
     else if (xml->name == "AmbientLight"    ) return state.sceneMap[id] = loadAmbientLight    (xml);
     else if (xml->name == "TriangleLight"   ) return state.sceneMap[id] = loadTriangleLight   (xml);
     else if (xml->name == "AnimatedLight"   ) return state.sceneMap[id] = loadAnimatedLight   (xml);
     else if (xml->name == "QuadLight"       ) return state.sceneMap[id] = loadQuadLight       (xml);
     else THROW_RUNTIME_ERROR(xml->loc.str()+": invalid light node: "+xml->name);
   }